

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::Reader::decodeString(Reader *this,Token *token,string *decoded)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  Location end;
  uint uVar4;
  Location extra;
  uint unicode;
  string local_58;
  Location local_38;
  
  std::__cxx11::string::reserve((ulong)decoded);
  end = token->end_ + -1;
  local_38 = token->start_ + 1;
LAB_00108422:
  if (local_38 == end) {
    return true;
  }
  extra = local_38 + 1;
  if (*local_38 != '\\') {
    if (*local_38 == '\"') {
      return true;
    }
    goto LAB_00108533;
  }
  if (extra == end) {
    local_38 = extra;
    std::__cxx11::string::string
              ((string *)&local_58,"Empty escape sequence in string",(allocator *)&unicode);
    addError(this,&local_58,token,extra);
    goto LAB_00108656;
  }
  extra = local_38 + 2;
  cVar1 = local_38[1];
  local_38 = extra;
  switch(cVar1) {
  case 'n':
    break;
  case 'o':
  case 'p':
  case 'q':
  case 's':
switchD_001084af_caseD_6f:
    std::__cxx11::string::string
              ((string *)&local_58,"Bad escape sequence in string",(allocator *)&unicode);
    addError(this,&local_58,token,extra);
LAB_00108656:
    std::__cxx11::string::~string((string *)&local_58);
    return false;
  case 'r':
    break;
  case 't':
    break;
  case 'u':
    bVar2 = decodeUnicodeCodePoint(this,token,&local_38,end,&unicode);
    uVar4 = unicode;
    if (!bVar2) {
      return false;
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    if (unicode < 0x80) {
      std::__cxx11::string::resize((ulong)&local_58);
LAB_00108603:
      *local_58._M_dataplus._M_p = (char)uVar4;
    }
    else {
      bVar3 = (byte)unicode;
      if (unicode < 0x800) {
        std::__cxx11::string::resize((ulong)&local_58);
        local_58._M_dataplus._M_p[1] = bVar3 & 0x3f | 0x80;
        uVar4 = (uint)(byte)((byte)(uVar4 >> 6) | 0xc0);
        goto LAB_00108603;
      }
      if (unicode < 0x10000) {
        std::__cxx11::string::resize((ulong)&local_58);
        local_58._M_dataplus._M_p[2] = bVar3 & 0x3f | 0x80;
        local_58._M_dataplus._M_p[1] = (byte)(uVar4 >> 6) & 0x3f | 0x80;
        uVar4 = (uint)(byte)((byte)(uVar4 >> 0xc) | 0xe0);
        goto LAB_00108603;
      }
      if (unicode < 0x110000) {
        std::__cxx11::string::resize((ulong)&local_58);
        local_58._M_dataplus._M_p[3] = bVar3 & 0x3f | 0x80;
        local_58._M_dataplus._M_p[2] = (byte)(uVar4 >> 6) & 0x3f | 0x80;
        local_58._M_dataplus._M_p[1] = (byte)(uVar4 >> 0xc) & 0x3f | 0x80;
        uVar4 = (uint)(byte)((byte)(uVar4 >> 0x12) | 0xf0);
        goto LAB_00108603;
      }
    }
    std::__cxx11::string::append((string *)decoded);
    std::__cxx11::string::~string((string *)&local_58);
    goto LAB_00108422;
  default:
    if ((((cVar1 != 'f') && (cVar1 != '/')) && (cVar1 != '\\')) &&
       ((cVar1 != 'b' && (cVar1 != '\"')))) goto switchD_001084af_caseD_6f;
  }
LAB_00108533:
  local_38 = extra;
  std::__cxx11::string::push_back((char)decoded);
  local_38 = extra;
  goto LAB_00108422;
}

Assistant:

bool Reader::decodeString(Token& token, std::string& decoded) {
  decoded.reserve(token.end_ - token.start_ - 2);
  Location current = token.start_ + 1; // skip '"'
  Location end = token.end_ - 1;       // do not include '"'
  while (current != end) {
    Char c = *current++;
    if (c == '"')
      break;
    else if (c == '\\') {
      if (current == end)
        return addError("Empty escape sequence in string", token, current);
      Char escape = *current++;
      switch (escape) {
      case '"':
        decoded += '"';
        break;
      case '/':
        decoded += '/';
        break;
      case '\\':
        decoded += '\\';
        break;
      case 'b':
        decoded += '\b';
        break;
      case 'f':
        decoded += '\f';
        break;
      case 'n':
        decoded += '\n';
        break;
      case 'r':
        decoded += '\r';
        break;
      case 't':
        decoded += '\t';
        break;
      case 'u': {
        unsigned int unicode;
        if (!decodeUnicodeCodePoint(token, current, end, unicode))
          return false;
        decoded += codePointToUTF8(unicode);
      } break;
      default:
        return addError("Bad escape sequence in string", token, current);
      }
    } else {
      decoded += c;
    }
  }
  return true;
}